

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointPoint.cpp
# Opt level: O2

ChVectorDynamic<> __thiscall
chrono::fea::ChLinkPointPoint::GetConstraintViolation(ChLinkPointPoint *this)

{
  Index extraout_RDX;
  long in_RSI;
  ChVectorDynamic<> CVar1;
  ChVectorN<double,_3> C;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_28 [16];
  double local_18;
  
  local_18 = *(double *)(*(long *)(in_RSI + 600) + 0x30) -
             *(double *)(*(long *)(in_RSI + 0x268) + 0x30);
  local_28 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>  [16])
             vsubpd_avx(*(undefined1 (*) [16])(*(long *)(in_RSI + 600) + 0x20),
                        *(undefined1 (*) [16])(*(long *)(in_RSI + 0x268) + 0x20));
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,local_28);
  CVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  CVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ChVectorDynamic<>)
         CVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

ChVectorDynamic<> ChLinkPointPoint::GetConstraintViolation() const {
    ChVector<> res = mnodeA->GetPos() - mnodeB->GetPos();
    ChVectorN<double, 3> C;
    C(0) = res.x();
    C(1) = res.y();
    C(2) = res.z();
    return C;
}